

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

Vec_Int_t * Abc_NtkDelayTraceSlackStart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int nCapMin;
  
  iVar5 = pNtk->vObjs->nSize;
  iVar1 = Abc_NtkGetTotalFanins(pNtk);
  p = Vec_IntAlloc(iVar5 + iVar1);
  Vec_IntFill(p,pNtk->vObjs->nSize,-1);
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      iVar1 = p->nSize;
      Vec_IntWriteEntry(p,iVar5,iVar1);
      for (iVar4 = 0; iVar4 < (pAVar2->vFanins).nSize; iVar4 = iVar4 + 1) {
        if (iVar1 == p->nCap) {
          nCapMin = iVar1 * 2;
          if (iVar1 < 0x10) {
            nCapMin = 0x10;
          }
          Vec_IntGrow(p,nCapMin);
          iVar1 = p->nSize;
        }
        lVar3 = (long)iVar1;
        iVar1 = iVar1 + 1;
        p->nSize = iVar1;
        p->pArray[lVar3] = -1;
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkDelayTraceSlackStart( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vSlacks;
    Abc_Obj_t * pObj;
    int i, k;
    vSlacks = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) + Abc_NtkGetTotalFanins(pNtk) );
    Vec_IntFill( vSlacks, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vSlacks, i, Vec_IntSize(vSlacks) );
        for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
            Vec_IntPush( vSlacks, -1 );
    }
//    assert( Abc_MaxInt(16, Vec_IntSize(vSlacks)) == Vec_IntCap(vSlacks) );
    return vSlacks;
}